

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void print_panel_seg(int n,int w,int jcol,int nseg,int *segrep,int *repfnz)

{
  ulong uVar1;
  int iVar2;
  
  if (0 < w) {
    iVar2 = jcol;
    do {
      printf("\tcol %d:\n");
      if (0 < nseg) {
        uVar1 = 0;
        do {
          printf("\t\tseg %d, segrep %d, repfnz %d\n",uVar1 & 0xffffffff,(ulong)(uint)segrep[uVar1],
                 (ulong)(uint)repfnz[segrep[uVar1] + (iVar2 - jcol) * n]);
          uVar1 = uVar1 + 1;
        } while ((uint)nseg != uVar1);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < w + jcol);
  }
  return;
}

Assistant:

void print_panel_seg(int n, int w, int jcol, int nseg,
                     const int *segrep, const int *repfnz)
{
    int j, k;
    
    for (j = jcol; j < jcol+w; j++) {
	printf("\tcol %d:\n", j);
	for (k = 0; k < nseg; k++)
	    printf("\t\tseg %d, segrep %d, repfnz %d\n", k, 
			segrep[k], repfnz[(j-jcol)*n + segrep[k]]);
    }

}